

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O0

void __thiscall Entity::Entity(Entity *this,Attributes *attrs)

{
  size_type sVar1;
  mapped_type *pmVar2;
  size_type sVar3;
  Attributes *attrs_local;
  Entity *this_local;
  
  Attributes::Attributes(&this->_attrs,attrs);
  this->_map = (Map *)0x0;
  sVar1 = std::
          map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
          ::count(&DEFAULT_PALETTES,(key_type_conflict *)this);
  if (sVar1 != 0) {
    pmVar2 = std::
             map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
             ::at(&DEFAULT_PALETTES,(key_type_conflict *)this);
    (this->_attrs).palette = *pmVar2;
  }
  sVar3 = std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::count
                    (&LIFTABLE_TYPES,(key_type_conflict *)this);
  if (sVar3 != 0) {
    (this->_attrs).liftable = true;
  }
  sVar3 = std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::count
                    (&FIGHTABLE_TYPES,(key_type_conflict *)this);
  if (sVar3 != 0) {
    (this->_attrs).fightable = true;
  }
  sVar3 = std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::count
                    (&ENEMY_TYPES,(key_type_conflict *)this);
  if (sVar3 != 0) {
    (this->_attrs).fightable = true;
    (this->_attrs).speed = '\x01';
    (this->_attrs).behavior_id = 1;
  }
  return;
}

Assistant:

Entity::Entity(Attributes attrs) :
    _attrs  (std::move(attrs)),
    _map    (nullptr)
{
    if(DEFAULT_PALETTES.count(_attrs.type_id))
        _attrs.palette = DEFAULT_PALETTES.at(_attrs.type_id);

    if(LIFTABLE_TYPES.count(_attrs.type_id))
        _attrs.liftable = true;

    if(FIGHTABLE_TYPES.count(_attrs.type_id))
        _attrs.fightable = true;

    if(ENEMY_TYPES.count(_attrs.type_id))
    {
        _attrs.fightable = true;
        _attrs.speed = 1;
        _attrs.behavior_id = 1;
    }
}